

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkCollapse(Abc_Ntk_t *pNtk,int fBddSizeMax,int fDualRail,int fReorder,int fReverse,
               int fDumpOrder,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  void *pvVar5;
  DdManager *dd;
  abctime aVar6;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar7;
  
  aVar4 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                  ,0xd4,"Abc_Ntk_t *Abc_NtkCollapse(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  pvVar5 = Abc_NtkBuildGlobalBdds(pNtk,fBddSizeMax,1,fReorder,fReverse,fVerbose);
  if (pvVar5 != (void *)0x0) {
    if (fVerbose != 0) {
      dd = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
      uVar1 = Cudd_ReadKeys(dd);
      uVar2 = Cudd_ReadDead(dd);
      iVar3 = 0x7a95fc;
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar1 - uVar2));
      Abc_Print(iVar3,"%s =","BDD construction time");
      aVar6 = Abc_Clock();
      Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
    }
    if (fDumpOrder != 0) {
      Abc_NtkDumpVariableOrder(pNtk);
    }
    pNtk_00 = Abc_NtkFromGlobalBdds(pNtk,fReverse);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      Abc_NtkMinimumBase2(pNtk_00);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar7 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar7;
      }
      iVar3 = Abc_NtkCheck(pNtk_00);
      if (iVar3 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkCollapse: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkCollapse( Abc_Ntk_t * pNtk, int fBddSizeMax, int fDualRail, int fReorder, int fReverse, int fDumpOrder, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, fReverse, fVerbose) == NULL )
        return NULL;
    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }
    if ( fDumpOrder ) 
        Abc_NtkDumpVariableOrder( pNtk );

    // create the new network
    pNtkNew = Abc_NtkFromGlobalBdds( pNtk, fReverse );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    if ( pNtkNew == NULL )
        return NULL;

    // make the network minimum base
    Abc_NtkMinimumBase2( pNtkNew );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}